

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void HighsHashTree<int,void>::mergeIntoLeaf<1,2>
               (InnerLeaf<1> *leaf,InnerLeaf<2> *mergeLeaf,int hashPos)

{
  ulong uVar1;
  array<HighsHashTableEntry<int,_void>,_22UL> *entry;
  int i;
  long lVar2;
  
  entry = &mergeLeaf->entries;
  for (lVar2 = 0; lVar2 < mergeLeaf->size; lVar2 = lVar2 + 1) {
    uVar1 = (ulong)(uint)entry->_M_elems[0].value_;
    HighsHashTree<int,_void>::InnerLeaf<1>::insert_entry
              (leaf,uVar1 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                    uVar1 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,hashPos,entry->_M_elems);
    entry = (array<HighsHashTableEntry<int,_void>,_22UL> *)(entry->_M_elems + 1);
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }